

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type * __thiscall
QList<QSocks5RevivedDatagram>::takeFirst
          (value_type *__return_storage_ptr__,QList<QSocks5RevivedDatagram> *this)

{
  iterator iVar1;
  
  *(undefined1 **)&__return_storage_ptr__->port = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->address).d.d.ptr = (QHostAddressPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->data).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = begin(this);
  QSocks5RevivedDatagram::QSocks5RevivedDatagram(__return_storage_ptr__,iVar1.i);
  QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::eraseFirst
            ((QGenericArrayOps<QSocks5RevivedDatagram> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }